

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

_Bool iter_advance_n_bytes(bfy_iter *iter,size_t n)

{
  size_t *psVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong uVar4;
  
  do {
    uVar4 = n;
    uVar2 = (iter->io).iov_len;
    if (uVar4 <= uVar2) {
      (iter->io).iov_base = (void *)((long)(iter->io).iov_base + uVar4);
      (iter->io).iov_len = uVar2 - uVar4;
      psVar1 = &(iter->cur).page_pos;
      *psVar1 = *psVar1 + uVar4;
      psVar1 = &(iter->cur).content_pos;
      *psVar1 = *psVar1 + uVar4;
      break;
    }
    _Var3 = iter_next_page(iter);
    n = uVar4 - uVar2;
  } while (_Var3);
  return uVar4 <= uVar2;
}

Assistant:

static bool
iter_advance_n_bytes(struct bfy_iter* const iter, size_t n) {
    while (iter->io.iov_len < n) { // make sure we're on the right page
        n -= iter->io.iov_len;
        if (!iter_next_page(iter)) {
            return false;
        }
    }
    iter->io = iov_drain(iter->io, n);
    iter->cur.page_pos += n;
    iter->cur.content_pos += n;
    return true;
}